

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vtls.c
# Opt level: O1

CURLcode Curl_ssl_addsessionid
                   (Curl_cfilter *cf,Curl_easy *data,void *ssl_sessionid,size_t idsize,_Bool *added)

{
  void *pvVar1;
  connectdata *pcVar2;
  Curl_share *pCVar3;
  ulong uVar4;
  Curl_ssl_session *pCVar5;
  _Bool _Var6;
  char *pcVar7;
  int iVar8;
  ulong uVar9;
  ulong uVar10;
  long lVar11;
  Curl_ssl_session *session;
  long *plVar12;
  long lVar13;
  char *local_60;
  
  lVar13 = 0x1c0;
  if (cf->cft == &Curl_cft_ssl_proxy) {
    lVar13 = 0x230;
  }
  pvVar1 = cf->ctx;
  pcVar2 = cf->conn;
  if (added != (_Bool *)0x0) {
    *added = false;
  }
  session = (data->state).session;
  if (session == (Curl_ssl_session *)0x0) {
    return CURLE_OK;
  }
  lVar11 = session->age;
  pcVar7 = (*Curl_cstrdup)(*(char **)((long)pvVar1 + 8));
  if (pcVar7 == (char *)0x0) {
    return CURLE_OUT_OF_MEMORY;
  }
  if (((cf->conn->bits).field_0x1 & 2) == 0) {
    local_60 = (char *)0x0;
  }
  else {
    local_60 = (*Curl_cstrdup)((cf->conn->conn_to_host).name);
    if (local_60 == (char *)0x0) {
      (*Curl_cfree)(pcVar7);
      return CURLE_OUT_OF_MEMORY;
    }
  }
  iVar8 = -1;
  if (((cf->conn->bits).field_0x1 & 4) != 0) {
    iVar8 = cf->conn->conn_to_port;
  }
  pCVar3 = data->share;
  if ((pCVar3 == (Curl_share *)0x0) || ((pCVar3->specifier & 0x10) == 0)) {
    plVar12 = &(data->state).sessionage;
  }
  else {
    plVar12 = &pCVar3->sessionage;
  }
  uVar4 = (data->set).general_ssl.max_ssl_sessions;
  uVar9 = 1;
  uVar10 = uVar9;
  if (1 < uVar4) {
    pCVar5 = (data->state).session;
    do {
      uVar10 = uVar9;
      if (pCVar5[1].sessionid == (void *)0x0) break;
      if (pCVar5[1].age < lVar11) {
        lVar11 = pCVar5[1].age;
        session = pCVar5 + 1;
      }
      uVar9 = uVar9 + 1;
      uVar10 = uVar4;
      pCVar5 = pCVar5 + 1;
    } while (uVar4 != uVar9);
  }
  if (uVar10 == uVar4) {
    Curl_ssl_kill_session(session);
  }
  else {
    session = (data->state).session + uVar10;
  }
  session->sessionid = ssl_sessionid;
  session->idsize = idsize;
  session->age = *plVar12;
  (*Curl_cfree)(session->name);
  (*Curl_cfree)(session->conn_to_host);
  session->name = pcVar7;
  session->conn_to_host = local_60;
  session->conn_to_port = iVar8;
  session->remote_port = *(int *)((long)pvVar1 + 0x50);
  session->scheme = cf->conn->handler->scheme;
  _Var6 = clone_ssl_primary_config
                    ((ssl_primary_config *)((long)&(pcVar2->bundle_node).ptr + lVar13),
                     &session->ssl_config);
  if (!_Var6) {
    Curl_free_primary_ssl_config(&session->ssl_config);
    session->sessionid = (void *)0x0;
    (*Curl_cfree)(pcVar7);
    (*Curl_cfree)(local_60);
    return CURLE_OUT_OF_MEMORY;
  }
  if (added != (_Bool *)0x0) {
    *added = true;
    return CURLE_OK;
  }
  return CURLE_OK;
}

Assistant:

CURLcode Curl_ssl_addsessionid(struct Curl_cfilter *cf,
                               struct Curl_easy *data,
                               void *ssl_sessionid,
                               size_t idsize,
                               bool *added)
{
  struct ssl_connect_data *connssl = cf->ctx;
  struct ssl_config_data *ssl_config = Curl_ssl_cf_get_config(cf, data);
  struct ssl_primary_config *conn_config = Curl_ssl_cf_get_primary_config(cf);
  size_t i;
  struct Curl_ssl_session *store;
  long oldest_age;
  char *clone_host;
  char *clone_conn_to_host;
  int conn_to_port;
  long *general_age;

  if(added)
    *added = FALSE;

  if(!data->state.session)
    return CURLE_OK;

  store = &data->state.session[0];
  oldest_age = data->state.session[0].age; /* zero if unused */
  (void)ssl_config;
  DEBUGASSERT(ssl_config->primary.sessionid);

  clone_host = strdup(connssl->peer.hostname);
  if(!clone_host)
    return CURLE_OUT_OF_MEMORY; /* bail out */

  if(cf->conn->bits.conn_to_host) {
    clone_conn_to_host = strdup(cf->conn->conn_to_host.name);
    if(!clone_conn_to_host) {
      free(clone_host);
      return CURLE_OUT_OF_MEMORY; /* bail out */
    }
  }
  else
    clone_conn_to_host = NULL;

  if(cf->conn->bits.conn_to_port)
    conn_to_port = cf->conn->conn_to_port;
  else
    conn_to_port = -1;

  /* Now we should add the session ID and the host name to the cache, (remove
     the oldest if necessary) */

  /* If using shared SSL session, lock! */
  if(SSLSESSION_SHARED(data)) {
    general_age = &data->share->sessionage;
  }
  else {
    general_age = &data->state.sessionage;
  }

  /* find an empty slot for us, or find the oldest */
  for(i = 1; (i < data->set.general_ssl.max_ssl_sessions) &&
        data->state.session[i].sessionid; i++) {
    if(data->state.session[i].age < oldest_age) {
      oldest_age = data->state.session[i].age;
      store = &data->state.session[i];
    }
  }
  if(i == data->set.general_ssl.max_ssl_sessions)
    /* cache is full, we must "kill" the oldest entry! */
    Curl_ssl_kill_session(store);
  else
    store = &data->state.session[i]; /* use this slot */

  /* now init the session struct wisely */
  store->sessionid = ssl_sessionid;
  store->idsize = idsize;
  store->age = *general_age;    /* set current age */
  /* free it if there's one already present */
  free(store->name);
  free(store->conn_to_host);
  store->name = clone_host;               /* clone host name */
  store->conn_to_host = clone_conn_to_host; /* clone connect to host name */
  store->conn_to_port = conn_to_port; /* connect to port number */
  /* port number */
  store->remote_port = connssl->port;
  store->scheme = cf->conn->handler->scheme;

  if(!clone_ssl_primary_config(conn_config, &store->ssl_config)) {
    Curl_free_primary_ssl_config(&store->ssl_config);
    store->sessionid = NULL; /* let caller free sessionid */
    free(clone_host);
    free(clone_conn_to_host);
    return CURLE_OUT_OF_MEMORY;
  }

  if(added)
    *added = TRUE;

  DEBUGF(infof(data, "Added Session ID to cache for %s://%s:%d [%s]",
               store->scheme, store->name, store->remote_port,
               Curl_ssl_cf_is_proxy(cf) ? "PROXY" : "server"));
  return CURLE_OK;
}